

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void duckdb::ListFinalize
               (Vector *states_vector,AggregateInputData *aggr_input_data,Vector *result,idx_t count
               ,idx_t offset)

{
  ListAggState *pLVar1;
  uint64_t uVar2;
  ListAggState **ppLVar3;
  list_entry_t *plVar4;
  ListBindData *pLVar5;
  idx_t iVar6;
  UnifiedVectorFormat *pUVar7;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *in_RCX;
  Vector *in_RDX;
  ulong in_RDI;
  long in_R8;
  idx_t current_offset;
  idx_t rid_1;
  ListAggState *state_1;
  idx_t i_1;
  Vector *result_child;
  idx_t total_capacity;
  idx_t rid;
  ListAggState *state;
  idx_t i;
  ListBindData *list_bind_data;
  size_t total_len;
  list_entry_t *result_data;
  ValidityMask *mask;
  ListAggState **states;
  UnifiedVectorFormat states_data;
  idx_t in_stack_fffffffffffffec8;
  ListAggState **ppLVar9;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed0;
  UnifiedVectorFormat *local_d8;
  UnifiedVectorFormat *local_b0;
  ulong local_a0;
  SelectionVector *local_70 [9];
  long local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  ulong local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat(local_8,local_20);
  ppLVar3 = UnifiedVectorFormat::GetData<duckdb::ListAggState*>((UnifiedVectorFormat *)local_70);
  FlatVector::Validity((Vector *)0xb4205f);
  plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xb42080);
  local_a0 = duckdb::ListVector::GetListSize(local_18);
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffed0);
  pLVar5 = FunctionData::Cast<duckdb::ListBindData>((FunctionData *)in_stack_fffffffffffffed0);
  for (local_b0 = (UnifiedVectorFormat *)0x0; local_b0 < local_20; local_b0 = local_b0 + 1) {
    iVar6 = SelectionVector::get_index(local_70[0],(idx_t)local_b0);
    pLVar1 = ppLVar3[iVar6];
    pUVar7 = local_b0 + local_28;
    plVar4[(long)pUVar7].offset = local_a0;
    if (*(long *)pLVar1 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      plVar4[(long)pUVar7].length = 0;
    }
    else {
      uVar2 = *(uint64_t *)pLVar1;
      plVar4[(long)pUVar7].length = uVar2;
      local_a0 = uVar2 + local_a0;
    }
  }
  duckdb::ListVector::Reserve(local_18,local_a0);
  pUVar8 = (UnifiedVectorFormat *)duckdb::ListVector::GetEntry(local_18);
  pUVar7 = pUVar8;
  for (local_d8 = (UnifiedVectorFormat *)0x0; local_d8 < local_20; local_d8 = local_d8 + 1) {
    ppLVar9 = ppLVar3;
    iVar6 = SelectionVector::get_index(local_70[0],(idx_t)local_d8);
    if (*(long *)ppLVar9[iVar6] != 0) {
      duckdb::ListSegmentFunctions::BuildListVector
                ((LinkedList *)&pLVar5->functions,(Vector *)ppLVar9[iVar6],(ulong)pUVar8);
    }
  }
  duckdb::ListVector::SetListSize(local_18,local_a0);
  UnifiedVectorFormat::~UnifiedVectorFormat(pUVar7);
  return;
}

Assistant:

static void ListFinalize(Vector &states_vector, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
                         idx_t offset) {

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	auto &mask = FlatVector::Validity(result);
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	size_t total_len = ListVector::GetListSize(result);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	// first iterate over all entries and set up the list entries, and get the newly required total length
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		result_data[rid].offset = total_len;
		if (state.linked_list.total_capacity == 0) {
			mask.SetInvalid(rid);
			result_data[rid].length = 0;
			continue;
		}

		// set the length and offset of this list in the result vector
		auto total_capacity = state.linked_list.total_capacity;
		result_data[rid].length = total_capacity;
		total_len += total_capacity;
	}

	// reserve capacity, then iterate over all entries again and copy over the data to the child vector
	ListVector::Reserve(result, total_len);
	auto &result_child = ListVector::GetEntry(result);
	for (idx_t i = 0; i < count; i++) {

		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		if (state.linked_list.total_capacity == 0) {
			continue;
		}

		idx_t current_offset = result_data[rid].offset;
		list_bind_data.functions.BuildListVector(state.linked_list, result_child, current_offset);
	}

	ListVector::SetListSize(result, total_len);
}